

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  bool bVar1;
  XmlFormatting fmt;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint local_180;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150 [32];
  undefined1 local_130 [16];
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  string stylesheetRef;
  TestRunInfo *testInfo_local;
  XmlReporter *this_local;
  
  stylesheetRef.field_2._8_8_ = testInfo;
  StreamingReporterBase<Catch::XmlReporter>::testRunStarting
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,testInfo);
  (*(this->super_StreamingReporterBase<Catch::XmlReporter>).super_IStreamingReporter.
    _vptr_IStreamingReporter[0x12])(local_38);
  bVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  if (!bVar1) {
    XmlWriter::writeStylesheetRef(&this->m_xml,(string *)local_38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Catch",&local_69);
  fmt = operator|(Newline,Indent);
  XmlWriter::startElement(&this->m_xml,&local_68,fmt);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
  (*(peVar3->super_NonCopyable)._vptr_NonCopyable[4])(&local_90);
  bVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"name",&local_b1);
    peVar3 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
    (*(peVar3->super_NonCopyable)._vptr_NonCopyable[4])(&local_d8);
    XmlWriter::writeAttribute(&this->m_xml,&local_b0,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
  iVar2 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"filters",&local_f9);
    peVar3 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
    iVar2 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((string *)(local_130 + 0x10),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var_00,iVar2));
    XmlWriter::writeAttribute(&this->m_xml,&local_f8,(string *)(local_130 + 0x10));
    std::__cxx11::string::~string((string *)(local_130 + 0x10));
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
  iVar2 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_150,"Randomness",&local_151);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_130,(string *)&this->m_xml,(XmlFormatting)local_150)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"seed",&local_179);
    peVar3 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
    local_180 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::ScopedElement::writeAttribute<unsigned_int>
              ((ScopedElement *)local_130,&local_178,&local_180);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_130);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement( "Catch" );
        if( !m_config->name().empty() )
            m_xml.writeAttribute( "name", m_config->name() );
        if (m_config->testSpec().hasFilters())
            m_xml.writeAttribute( "filters", serializeFilters( m_config->getTestsOrTags() ) );
        if( m_config->rngSeed() != 0 )
            m_xml.scopedElement( "Randomness" )
                .writeAttribute( "seed", m_config->rngSeed() );
    }